

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

int64_t av1_highbd_pixel_proj_error_c
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  uint uVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000010;
  int *in_stack_00000028;
  int local_84;
  uint8_t *puStack_80;
  int32_t e_2;
  int32_t s_2;
  int32_t d_2;
  int32_t e_1;
  int32_t v_1;
  int32_t u_1;
  int32_t s_1;
  int32_t d_1;
  int flt_stride;
  int32_t *flt;
  int exq;
  int32_t e;
  int32_t v;
  int32_t v1;
  int32_t v0;
  int32_t u;
  int32_t s;
  int32_t d;
  int xq1;
  int xq0;
  int32_t half;
  int64_t err;
  int j;
  int i;
  uint16_t *dat;
  uint16_t *src;
  
  _d = in_RDI << 1;
  _u = in_R8 << 1;
  _e = 0;
  if ((*flt0 < 1) || (flt0[1] < 1)) {
    if ((*flt0 < 1) && (flt0[1] < 1)) {
      for (v0 = 0; v0 < in_EDX; v0 = v0 + 1) {
        for (v1 = 0; v1 < in_ESI; v1 = v1 + 1) {
          iVar2 = (uint)*(ushort *)(_u + (long)v1 * 2) - (uint)*(ushort *)(_d + (long)v1 * 2);
          _e = (long)iVar2 * (long)iVar2 + _e;
        }
        _u = _u + (long)in_R9D * 2;
        _d = _d + (long)in_ECX * 2;
      }
    }
    else {
      if (*flt0 < 1) {
        d_2 = in_stack_00000028[1];
        puStack_80 = _height;
        local_84 = (int)src8;
      }
      else {
        d_2 = *in_stack_00000028;
        puStack_80 = dat8;
        local_84 = in_stack_00000010;
      }
      for (v0 = 0; v0 < in_EDX; v0 = v0 + 1) {
        for (v1 = 0; v1 < in_ESI; v1 = v1 + 1) {
          uVar1 = (uint)*(ushort *)(_u + (long)v1 * 2);
          iVar2 = (((int)(d_2 * (*(int *)(puStack_80 + (long)v1 * 4) + uVar1 * -0x10) + 0x400) >>
                   0xb) + uVar1) - (uint)*(ushort *)(_d + (long)v1 * 2);
          _e = (long)iVar2 * (long)iVar2 + _e;
        }
        _u = _u + (long)in_R9D * 2;
        puStack_80 = puStack_80 + (long)local_84 * 4;
        _d = _d + (long)in_ECX * 2;
      }
    }
  }
  else {
    for (v0 = 0; v0 < in_EDX; v0 = v0 + 1) {
      for (v1 = 0; v1 < in_ESI; v1 = v1 + 1) {
        uVar1 = (uint)*(ushort *)(_u + (long)v1 * 2);
        iVar2 = (((int)(in_stack_00000028[1] * (*(int *)(_height + (long)v1 * 4) + uVar1 * -0x10) +
                       *in_stack_00000028 * (*(int *)(dat8 + (long)v1 * 4) + uVar1 * -0x10) + 0x400)
                 >> 0xb) + uVar1) - (uint)*(ushort *)(_d + (long)v1 * 2);
        _e = (long)iVar2 * (long)iVar2 + _e;
      }
      _u = _u + (long)in_R9D * 2;
      dat8 = dat8 + (long)in_stack_00000010 * 4;
      _height = _height + (long)(int)src8 * 4;
      _d = _d + (long)in_ECX * 2;
    }
  }
  return _e;
}

Assistant:

int64_t av1_highbd_pixel_proj_error_c(const uint8_t *src8, int width,
                                      int height, int src_stride,
                                      const uint8_t *dat8, int dat_stride,
                                      int32_t *flt0, int flt0_stride,
                                      int32_t *flt1, int flt1_stride, int xq[2],
                                      const sgr_params_type *params) {
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dat = CONVERT_TO_SHORTPTR(dat8);
  int i, j;
  int64_t err = 0;
  const int32_t half = 1 << (SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS - 1);
  if (params->r[0] > 0 && params->r[1] > 0) {
    int xq0 = xq[0];
    int xq1 = xq[1];
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t d = dat[j];
        const int32_t s = src[j];
        const int32_t u = (int32_t)(d << SGRPROJ_RST_BITS);
        int32_t v0 = flt0[j] - u;
        int32_t v1 = flt1[j] - u;
        int32_t v = half;
        v += xq0 * v0;
        v += xq1 * v1;
        const int32_t e = (v >> (SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS)) + d - s;
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
      src += src_stride;
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {
    int exq;
    int32_t *flt;
    int flt_stride;
    if (params->r[0] > 0) {
      exq = xq[0];
      flt = flt0;
      flt_stride = flt0_stride;
    } else {
      exq = xq[1];
      flt = flt1;
      flt_stride = flt1_stride;
    }
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t d = dat[j];
        const int32_t s = src[j];
        const int32_t u = (int32_t)(d << SGRPROJ_RST_BITS);
        int32_t v = half;
        v += exq * (flt[j] - u);
        const int32_t e = (v >> (SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS)) + d - s;
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      flt += flt_stride;
      src += src_stride;
    }
  } else {
    for (i = 0; i < height; ++i) {
      for (j = 0; j < width; ++j) {
        const int32_t d = dat[j];
        const int32_t s = src[j];
        const int32_t e = d - s;
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
  }
  return err;
}